

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O3

uint64_t sum_quotients<unsigned_int,libdivide::divider<unsigned_int,(libdivide::Branching)0>>
                   (random_numerators<unsigned_int> *vals,
                   divider<unsigned_int,_(libdivide::Branching)0> *div)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  uint64_t xl;
  
  uVar3 = 0;
  if ((ulong)vals->_length != 0) {
    uVar4 = (ulong)(div->div).denom.magic;
    bVar1 = (div->div).denom.more;
    lVar5 = 0;
    do {
      uVar2 = *(uint *)((long)vals->_pData + lVar5);
      if (uVar4 == 0) {
        uVar6 = uVar2 >> (bVar1 & 0x1f);
      }
      else {
        uVar6 = (uint)(uVar4 * uVar2 >> 0x20);
        if ((bVar1 & 0x40) == 0) {
          uVar6 = uVar6 >> (bVar1 & 0x1f);
        }
        else {
          uVar6 = (uVar2 - uVar6 >> 1) + uVar6 >> (bVar1 & 0x1f);
        }
      }
      uVar6 = (int)uVar3 + uVar6;
      uVar3 = (ulong)uVar6;
      lVar5 = lVar5 + 4;
    } while ((ulong)vals->_length << 2 != lVar5);
    uVar3 = (ulong)uVar6;
  }
  return uVar3;
}

Assistant:

NOINLINE uint64_t sum_quotients(const random_numerators<IntT> &vals, const Divisor &div) {
    // Need to use unsigned to avoid signed integer overlow.
    typedef typename std::make_unsigned<IntT>::type UIntT;
    UIntT sum = 0;
    for (auto iter = vals.begin(); iter != vals.end(); ++iter) {
        sum += (UIntT)(*iter / div);
    }
    return (uint64_t)sum;
}